

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::key_press(PathTracer *this,int key)

{
  BVHNode *pBVar1;
  _Elt_pointer ppBVar2;
  BVHNode **__x;
  ulong uVar3;
  
  ppBVar2 = (this->selectionHistory).c.
            super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar2 ==
      (this->selectionHistory).c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar2 = (this->selectionHistory).c.
              super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pBVar1 = ppBVar2[-1];
  if (key == 0x3c) {
LAB_0018dd83:
    if (pBVar1->l == (BVHNode *)0x0) {
      return;
    }
    __x = &pBVar1->l;
    goto LAB_0018dd8e;
  }
  if (key == 0x3e) {
LAB_0018dd76:
    if (pBVar1->l == (BVHNode *)0x0) {
      return;
    }
    __x = &pBVar1->r;
LAB_0018dd8e:
    std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>::
    push_back(&(this->selectionHistory).c,__x);
    return;
  }
  if (key == 0x3f) {
LAB_0018dd96:
    if (pBVar1 != this->bvh->root) {
      std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>::
      pop_back(&(this->selectionHistory).c);
      return;
    }
  }
  else {
    if (key != 0x53) {
      if (key == 0x5b) {
        uVar3 = 1;
        if (1 < this->ns_aa) {
          uVar3 = this->ns_aa >> 1;
        }
LAB_0018ddbe:
        this->ns_aa = uVar3;
        printf("Samples per pixel changed to %lu\n");
        return;
      }
      if (key == 0x109) goto LAB_0018dd96;
      if (key != 0x73) {
        if (key != 0x106) {
          if (key != 0x107) {
            if (key != 0x5d) {
              return;
            }
            uVar3 = this->ns_aa * 2;
            goto LAB_0018ddbe;
          }
          goto LAB_0018dd83;
        }
        goto LAB_0018dd76;
      }
    }
    this->show_rays = (bool)(this->show_rays ^ 1);
  }
  return;
}

Assistant:

void PathTracer::key_press(int key) {

    BVHNode *current = selectionHistory.top();
    switch (key) {
      case ']':
        ns_aa *=2;
        printf("Samples per pixel changed to %lu\n", ns_aa);
        //tm_key = clamp(tm_key + 0.02f, 0.0f, 1.0f);
        break;
      case '[':
        //tm_key = clamp(tm_key - 0.02f, 0.0f, 1.0f);
        ns_aa /=2;
        if (ns_aa < 1) ns_aa = 1;
        printf("Samples per pixel changed to %lu\n", ns_aa);
        break;
      case KEYBOARD_UP: case '?':
        if (current != bvh->get_root()) {
          selectionHistory.pop();
        }
        break;
      case KEYBOARD_LEFT: case '<':
        if (current->l) {
          selectionHistory.push(current->l);
        }
        break;
      case KEYBOARD_RIGHT: case '>':
        if (current->l) {
          selectionHistory.push(current->r);
        }
        break;
      case 's':
      case 'S':
        show_rays = !show_rays;
      default:
        return;
    }
  }